

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyExporter.cpp
# Opt level: O3

void __thiscall Assimp::PlyExporter::WriteMeshIndices(PlyExporter *this,aiMesh *m,uint offset)

{
  aiFace *paVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (m->mNumFaces != 0) {
    uVar2 = 0;
    do {
      paVar1 = m->mFaces;
      std::ostream::_M_insert<unsigned_long>((ulong)this);
      if (paVar1[uVar2].mNumIndices != 0) {
        uVar3 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ",1);
          std::ostream::_M_insert<unsigned_long>((ulong)this);
          uVar3 = uVar3 + 1;
        } while (uVar3 < paVar1[uVar2].mNumIndices);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
      uVar2 = uVar2 + 1;
    } while (uVar2 < m->mNumFaces);
  }
  return;
}

Assistant:

void PlyExporter::WriteMeshIndices(const aiMesh* m, unsigned int offset)
{
    for (unsigned int i = 0; i < m->mNumFaces; ++i) {
        const aiFace& f = m->mFaces[i];
        mOutput << f.mNumIndices;
        for(unsigned int c = 0; c < f.mNumIndices; ++c) {
            mOutput << " " << (f.mIndices[c] + offset);
        }
        mOutput << endl;
    }
}